

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_for_in_next(JSContext *ctx,JSValue *sp)

{
  uint uVar1;
  JSAtom JVar2;
  long lVar3;
  int iVar4;
  JSShapeProperty *pJVar5;
  JSValueUnion *in_RSI;
  JSValue JVar6;
  JSShapeProperty *prs;
  JSShape *sh;
  int ret;
  JSForInIterator *it;
  JSAtom prop;
  JSObject *p;
  JSValue enum_obj;
  JSAtom in_stack_ffffffffffffff5c;
  undefined4 uStack_94;
  uint uStack_84;
  uint uStack_74;
  JSValueUnion local_68;
  JSValueUnion local_60;
  JSContext *pJVar7;
  JSContext *ctx_00;
  JSValueUnion JVar8;
  JSValueUnion *pJVar9;
  
  pJVar7 = *(JSContext **)&in_RSI[-2].int32;
  JVar8 = in_RSI[-1];
  if ((JVar8.int32 == -1) && ((pJVar7->header).dummy2 == 0x11)) {
    lVar3 = *(long *)&pJVar7->binary_object_count;
    ctx_00 = pJVar7;
LAB_0015f1e7:
    do {
      if (*(int *)(lVar3 + 0x10) == 0) {
        if ((uint)(pJVar7->rt->malloc_state).malloc_size <= *(uint *)(lVar3 + 0x18))
        goto LAB_0015f366;
        pJVar5 = get_shape_prop((JSShape *)pJVar7->rt);
        uVar1 = *(uint *)(lVar3 + 0x18);
        JVar2 = pJVar5[uVar1].atom;
        *(int *)(lVar3 + 0x18) = *(int *)(lVar3 + 0x18) + 1;
        if ((JVar2 == 0) || ((*(uint *)(pJVar5 + uVar1) >> 0x1a & 4) == 0)) goto LAB_0015f1e7;
      }
      else {
        if (*(uint *)(lVar3 + 0x14) <= *(uint *)(lVar3 + 0x18)) goto LAB_0015f366;
        __JS_AtomFromUInt32(*(uint32_t *)(lVar3 + 0x18));
        *(int *)(lVar3 + 0x18) = *(int *)(lVar3 + 0x18) + 1;
      }
      JVar6.tag = (int64_t)in_RSI;
      JVar6.u.float64 = JVar8.float64;
      iVar4 = JS_HasProperty(ctx_00,JVar6,(JSAtom)((ulong)pJVar7 >> 0x20));
      if (iVar4 < 0) {
        return iVar4;
      }
    } while (iVar4 == 0);
    pJVar9 = in_RSI;
    JVar6 = JS_AtomToValue((JSContext *)in_RSI,in_stack_ffffffffffffff5c);
    local_68 = JVar6.u;
    *in_RSI = local_68;
    local_60 = (JSValueUnion)JVar6.tag;
    in_RSI[1] = local_60;
    pJVar9[2].ptr = (void *)((ulong)uStack_74 << 0x20);
    pJVar9[3].float64 = 4.94065645841247e-324;
  }
  else {
LAB_0015f366:
    in_RSI->ptr = (void *)((ulong)uStack_84 << 0x20);
    in_RSI[1].float64 = 1.48219693752374e-323;
    JVar8._4_4_ = uStack_94;
    JVar8.int32 = 1;
    in_RSI[2] = JVar8;
    in_RSI[3].float64 = 4.94065645841247e-324;
  }
  return 0;
}

Assistant:

static __exception int js_for_in_next(JSContext *ctx, JSValue *sp)
{
    JSValueConst enum_obj;
    JSObject *p;
    JSAtom prop;
    JSForInIterator *it;
    int ret;

    enum_obj = sp[-1];
    /* fail safe */
    if (JS_VALUE_GET_TAG(enum_obj) != JS_TAG_OBJECT)
        goto done;
    p = JS_VALUE_GET_OBJ(enum_obj);
    if (p->class_id != JS_CLASS_FOR_IN_ITERATOR)
        goto done;
    it = p->u.for_in_iterator;

    for(;;) {
        if (it->is_array) {
            if (it->idx >= it->array_length)
                goto done;
            prop = __JS_AtomFromUInt32(it->idx);
            it->idx++;
        } else {
            JSShape *sh = p->shape;
            JSShapeProperty *prs;
            if (it->idx >= sh->prop_count)
                goto done;
            prs = get_shape_prop(sh) + it->idx;
            prop = prs->atom;
            it->idx++;
            if (prop == JS_ATOM_NULL || !(prs->flags & JS_PROP_ENUMERABLE))
                continue;
        }
        /* check if the property was deleted */
        ret = JS_HasProperty(ctx, it->obj, prop);
        if (ret < 0)
            return ret;
        if (ret)
            break;
    }
    /* return the property */
    sp[0] = JS_AtomToValue(ctx, prop);
    sp[1] = JS_FALSE;
    return 0;
 done:
    /* return the end */
    sp[0] = JS_UNDEFINED;
    sp[1] = JS_TRUE;
    return 0;
}